

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_value_numbering.cpp
# Opt level: O0

string * __thiscall
mocker::LocalValueNumbering::hash_abi_cxx11_
          (string *__return_storage_ptr__,LocalValueNumbering *this,
          shared_ptr<mocker::ir::IRInst> *inst,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *valueNumbers)

{
  ulong uVar1;
  pointer this_00;
  bool bVar2;
  bool bVar3;
  OpType OVar4;
  int iVar5;
  size_type sVar6;
  reference puVar7;
  element_type *this_01;
  shared_ptr<mocker::ir::Addr> *addr;
  element_type *this_02;
  element_type *peVar8;
  element_type *this_03;
  reference pvVar9;
  const_reference pvVar10;
  reference pvVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_928;
  pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_888;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  reference local_7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_7b8 [8];
  shared_ptr<mocker::ir::Phi> p_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  OpType local_6e8;
  undefined1 local_6e1;
  OpType op;
  OpType local_6bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  OpType local_694;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  OpType local_66c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  OpType local_644;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  OpType local_61c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  OpType local_5f4;
  pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_5f0;
  pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5e8;
  pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5c0;
  pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_598;
  pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_570;
  pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_548;
  pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_520;
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [8];
  shared_ptr<mocker::ir::RelationInst> p_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  OpType local_48c [11];
  pair<mocker::ir::ArithBinaryInst::OpType,_int> local_460;
  pair<mocker::ir::ArithBinaryInst::OpType,_int> local_458;
  pair<mocker::ir::ArithBinaryInst::OpType,_int> local_450;
  pair<mocker::ir::ArithBinaryInst::OpType,_int> local_448;
  pair<mocker::ir::ArithBinaryInst::OpType,_int> local_440;
  initializer_list<std::pair<mocker::ir::ArithBinaryInst::OpType,_int>_> local_438;
  undefined1 local_421;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  OpType local_3fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  OpType local_3d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  OpType local_3ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  OpType local_384;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  OpType local_35c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  OpType local_334;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  OpType local_30c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  OpType local_2e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  OpType local_2bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  OpType local_294;
  pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_290;
  pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_288;
  pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_260;
  pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  undefined1 local_f8 [16];
  undefined1 local_e8 [8];
  shared_ptr<mocker::ir::ArithBinaryInst> p_2;
  undefined1 local_b8 [8];
  shared_ptr<mocker::ir::ArithUnaryInst> p_1;
  undefined1 local_a0 [8];
  shared_ptr<mocker::ir::Assign> p;
  unsigned_long valueNumber;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vnStr;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *valueNumbers_local;
  shared_ptr<mocker::ir::IRInst> *inst_local;
  LocalValueNumbering *this_local;
  string *res;
  
  vnStr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)valueNumbers;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_40);
  sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     vnStr.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40,sVar6);
  this_00 = vnStr.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      vnStr.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  valueNumber = (unsigned_long)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     *)&valueNumber), bVar2) {
    puVar7 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end1);
    std::__cxx11::to_string
              ((string *)
               &p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               *puVar7);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string
              ((string *)
               &p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end1);
  }
  ir::dyc<mocker::ir::Assign,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)local_a0,inst);
  p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_1_ = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_a0);
  if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_1_) {
    this_01 = std::__shared_ptr_access<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_a0);
    addr = ir::Assign::getOperand(this_01);
    hash_abi_cxx11_(__return_storage_ptr__,this,addr);
  }
  p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _5_3_ = 0;
  std::shared_ptr<mocker::ir::Assign>::~shared_ptr((shared_ptr<mocker::ir::Assign> *)local_a0);
  if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ == 0) {
    ir::dyc<mocker::ir::ArithUnaryInst,std::shared_ptr<mocker::ir::IRInst>const&>
              ((ir *)local_b8,inst);
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_b8);
    if (bVar2) {
      this_02 = std::
                __shared_ptr_access<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_b8);
      OVar4 = ir::ArithUnaryInst::getOp(this_02);
      if (OVar4 == Neg) {
        s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &p_2.
                      super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,"-",1);
      }
      else {
        s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &p_2.
                      super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,"~",1);
      }
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_40,0);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &p_2.
                      super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,pvVar9);
      std::__cxx11::string::~string
                ((string *)
                 &p_2.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ = 1;
    }
    else {
      p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ = 0;
    }
    std::shared_ptr<mocker::ir::ArithUnaryInst>::~shared_ptr
              ((shared_ptr<mocker::ir::ArithUnaryInst> *)local_b8);
    if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ == 0) {
      ir::dyc<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::IRInst>const&>
                ((ir *)local_e8,inst);
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_e8);
      if (bVar2) {
        if ((hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
             ::names_abi_cxx11_ == '\0') &&
           (iVar5 = __cxa_guard_acquire(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                                         ::names_abi_cxx11_), iVar5 != 0)) {
          local_421 = 1;
          local_290 = &local_288;
          local_294 = BitOr;
          s_abi_cxx11_(&local_2b8,"|",1);
          std::
          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (&local_288,&local_294,&local_2b8);
          local_2bc = BitAnd;
          local_290 = &local_260;
          s_abi_cxx11_(&local_2e0,"&",1);
          std::
          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (&local_260,&local_2bc,&local_2e0);
          local_2e4 = Xor;
          local_290 = &local_238;
          s_abi_cxx11_(&local_308,"^",1);
          std::
          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (&local_238,&local_2e4,&local_308);
          local_30c = Shl;
          local_290 = &local_210;
          s_abi_cxx11_(&local_330,"<<",2);
          std::
          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (&local_210,&local_30c,&local_330);
          local_334 = Shr;
          local_290 = &local_1e8;
          s_abi_cxx11_(&local_358,">>",2);
          std::
          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (&local_1e8,&local_334,&local_358);
          local_35c = Add;
          local_290 = &local_1c0;
          s_abi_cxx11_(&local_380,"+",1);
          std::
          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (&local_1c0,&local_35c,&local_380);
          local_384 = Sub;
          local_290 = &local_198;
          s_abi_cxx11_(&local_3a8,"-",1);
          std::
          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (&local_198,&local_384,&local_3a8);
          local_3ac = Mul;
          local_290 = &local_170;
          s_abi_cxx11_(&local_3d0,"*",1);
          std::
          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (&local_170,&local_3ac,&local_3d0);
          local_3d4 = Div;
          local_290 = &local_148;
          s_abi_cxx11_(&local_3f8,"/",1);
          std::
          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (&local_148,&local_3d4,&local_3f8);
          local_3fc = Mod;
          local_290 = &local_120;
          s_abi_cxx11_(&local_420,"%",1);
          std::
          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (&local_120,&local_3fc,&local_420);
          local_421 = 0;
          local_f8._0_8_ = &local_288;
          local_f8._8_8_ = 10;
          SmallMap<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::SmallMap(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                      ::names_abi_cxx11_,
                     (initializer_list<std::pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_f8);
          local_888 = (pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_f8;
          do {
            local_888 = local_888 + -1;
            std::
            pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair(local_888);
          } while (local_888 != &local_288);
          std::__cxx11::string::~string((string *)&local_420);
          std::__cxx11::string::~string((string *)&local_3f8);
          std::__cxx11::string::~string((string *)&local_3d0);
          std::__cxx11::string::~string((string *)&local_3a8);
          std::__cxx11::string::~string((string *)&local_380);
          std::__cxx11::string::~string((string *)&local_358);
          std::__cxx11::string::~string((string *)&local_330);
          std::__cxx11::string::~string((string *)&local_308);
          std::__cxx11::string::~string((string *)&local_2e0);
          std::__cxx11::string::~string((string *)&local_2b8);
          __cxa_atexit(SmallMap<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::~SmallMap,
                       &hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                        ::names_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                               ::names_abi_cxx11_);
        }
        if ((hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
             ::associative == '\0') &&
           (iVar5 = __cxa_guard_acquire(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                                         ::associative), iVar5 != 0)) {
          local_48c[10] = 0;
          local_48c[9] = 0;
          std::pair<mocker::ir::ArithBinaryInst::OpType,_int>::
          pair<mocker::ir::ArithBinaryInst::OpType,_int,_true>
                    (&local_460,local_48c + 10,(int *)(local_48c + 9));
          local_48c[8] = 1;
          local_48c[7] = 0;
          std::pair<mocker::ir::ArithBinaryInst::OpType,_int>::
          pair<mocker::ir::ArithBinaryInst::OpType,_int,_true>
                    (&local_458,local_48c + 8,(int *)(local_48c + 7));
          local_48c[6] = 2;
          local_48c[5] = 0;
          std::pair<mocker::ir::ArithBinaryInst::OpType,_int>::
          pair<mocker::ir::ArithBinaryInst::OpType,_int,_true>
                    (&local_450,local_48c + 6,(int *)(local_48c + 5));
          local_48c[4] = 5;
          local_48c[3] = 0;
          std::pair<mocker::ir::ArithBinaryInst::OpType,_int>::
          pair<mocker::ir::ArithBinaryInst::OpType,_int,_true>
                    (&local_448,local_48c + 4,(int *)(local_48c + 3));
          local_48c[2] = 7;
          local_48c[1] = 0;
          std::pair<mocker::ir::ArithBinaryInst::OpType,_int>::
          pair<mocker::ir::ArithBinaryInst::OpType,_int,_true>
                    (&local_440,local_48c + 2,(int *)(local_48c + 1));
          local_438._M_array = &local_460;
          local_438._M_len = 5;
          SmallMap<mocker::ir::ArithBinaryInst::OpType,_int>::SmallMap
                    (&hash::associative,&local_438);
          __cxa_atexit(SmallMap<mocker::ir::ArithBinaryInst::OpType,_int>::~SmallMap,
                       &hash::associative,&__dso_handle);
          __cxa_guard_release(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                               ::associative);
        }
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_40);
        if (sVar6 != 2) {
          __assert_fail("vnStr.size() == 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/local_value_numbering.cpp"
                        ,0x6a,
                        "std::string mocker::LocalValueNumbering::hash(const std::shared_ptr<ir::IRInst> &, const std::vector<std::size_t> &)"
                       );
        }
        peVar8 = std::
                 __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_e8);
        local_48c[0] = ir::ArithBinaryInst::getOp(peVar8);
        bVar3 = SmallMap<mocker::ir::ArithBinaryInst::OpType,_int>::in(&hash::associative,local_48c)
        ;
        bVar2 = false;
        if (bVar3) {
          pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               vnStr.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
          uVar1 = *pvVar10;
          pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               vnStr.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
          bVar2 = *pvVar10 < uVar1;
        }
        if (bVar2) {
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_40,0);
          pvVar11 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_40,1);
          std::swap<char,std::char_traits<char>,std::allocator<char>>(pvVar9,pvVar11);
        }
        peVar8 = std::
                 __shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_e8);
        p_3.super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ = ir::ArithBinaryInst::getOp(peVar8);
        pbVar12 = SmallMap<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::at(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                        ::names_abi_cxx11_,
                       (OpType *)
                       ((long)&p_3.
                               super___shared_ptr<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi + 4));
        pvVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_40,0);
        std::operator+(&local_4d0,pbVar12,pvVar9);
        std::operator+(&local_4b0,&local_4d0,",");
        pvVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_40,1);
        std::operator+(__return_storage_ptr__,&local_4b0,pvVar9);
        std::__cxx11::string::~string((string *)&local_4b0);
        std::__cxx11::string::~string((string *)&local_4d0);
        p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ = 1;
      }
      else {
        p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ = 0;
      }
      std::shared_ptr<mocker::ir::ArithBinaryInst>::~shared_ptr
                ((shared_ptr<mocker::ir::ArithBinaryInst> *)local_e8);
      if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi._4_4_ == 0) {
        ir::dyc<mocker::ir::RelationInst,std::shared_ptr<mocker::ir::IRInst>const&>
                  ((ir *)local_4e8,inst);
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_4e8);
        if (bVar2) {
          if ((hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
               ::names_abi_cxx11_ == '\0') &&
             (iVar5 = __cxa_guard_acquire(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                                           ::names_abi_cxx11_), iVar5 != 0)) {
            local_6e1 = 1;
            local_5f0 = &local_5e8;
            local_5f4 = Eq;
            s_abi_cxx11_(&local_618,"==",2);
            std::
            pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      (&local_5e8,&local_5f4,&local_618);
            local_61c = Ne;
            local_5f0 = &local_5c0;
            s_abi_cxx11_(&local_640,"!=",2);
            std::
            pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      (&local_5c0,&local_61c,&local_640);
            local_644 = Lt;
            local_5f0 = &local_598;
            s_abi_cxx11_(&local_668,"<",1);
            std::
            pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      (&local_598,&local_644,&local_668);
            local_66c = Gt;
            local_5f0 = &local_570;
            s_abi_cxx11_(&local_690,">",1);
            std::
            pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      (&local_570,&local_66c,&local_690);
            local_694 = Le;
            local_5f0 = &local_548;
            s_abi_cxx11_(&local_6b8,"<=",2);
            std::
            pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      (&local_548,&local_694,&local_6b8);
            local_6bc = Ge;
            local_5f0 = &local_520;
            s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&op,
                         ">=",2);
            std::
            pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      (&local_520,&local_6bc,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&op);
            local_6e1 = 0;
            local_4f8._0_8_ = &local_5e8;
            local_4f8._8_8_ = 6;
            SmallMap<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::SmallMap(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                        ::names_abi_cxx11_,
                       (initializer_list<std::pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_4f8);
            local_928 = (pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_4f8;
            do {
              local_928 = local_928 + -1;
              std::
              pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair(local_928);
            } while (local_928 != &local_5e8);
            std::__cxx11::string::~string((string *)&op);
            std::__cxx11::string::~string((string *)&local_6b8);
            std::__cxx11::string::~string((string *)&local_690);
            std::__cxx11::string::~string((string *)&local_668);
            std::__cxx11::string::~string((string *)&local_640);
            std::__cxx11::string::~string((string *)&local_618);
            __cxa_atexit(SmallMap<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::~SmallMap,
                         &hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                          ::names_abi_cxx11_,&__dso_handle);
            __cxa_guard_release(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                                 ::names_abi_cxx11_);
          }
          sVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_40);
          if (sVar6 != 2) {
            __assert_fail("vnStr.size() == 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/local_value_numbering.cpp"
                          ,0x74,
                          "std::string mocker::LocalValueNumbering::hash(const std::shared_ptr<ir::IRInst> &, const std::vector<std::size_t> &)"
                         );
          }
          this_03 = std::
                    __shared_ptr_access<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ir::RelationInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_4e8);
          local_6e8 = ir::RelationInst::getOp(this_03);
          if (local_6e8 == Gt) {
            pvVar9 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_40,1);
            std::operator+(&local_728,"<",pvVar9);
            std::operator+(&local_708,&local_728,",");
            pvVar9 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_40,0);
            std::operator+(__return_storage_ptr__,&local_708,pvVar9);
            std::__cxx11::string::~string((string *)&local_708);
            std::__cxx11::string::~string((string *)&local_728);
            p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_4_ = 1;
          }
          else if (local_6e8 == Ge) {
            pvVar9 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_40,1);
            std::operator+(&local_768,"<=",pvVar9);
            std::operator+(&local_748,&local_768,",");
            pvVar9 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_40,0);
            std::operator+(__return_storage_ptr__,&local_748,pvVar9);
            std::__cxx11::string::~string((string *)&local_748);
            std::__cxx11::string::~string((string *)&local_768);
            p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_4_ = 1;
          }
          else {
            if ((local_6e8 == Eq) || (local_6e8 == Ne)) {
              pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   vnStr.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
              uVar1 = *pvVar10;
              pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   vnStr.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
              if (*pvVar10 < uVar1) {
                pvVar9 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_40,0);
                pvVar11 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_40,1);
                std::swap<char,std::char_traits<char>,std::allocator<char>>(pvVar9,pvVar11);
              }
            }
            pbVar12 = SmallMap<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::at(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                            ::names_abi_cxx11_,&local_6e8);
            pvVar9 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_40,0);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &p_4.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,pbVar12,pvVar9);
            std::operator+(&local_788,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &p_4.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,",");
            pvVar9 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_40,1);
            std::operator+(__return_storage_ptr__,&local_788,pvVar9);
            std::__cxx11::string::~string((string *)&local_788);
            std::__cxx11::string::~string
                      ((string *)
                       &p_4.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_4_ = 1;
          }
        }
        else {
          p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi._4_4_ = 0;
        }
        std::shared_ptr<mocker::ir::RelationInst>::~shared_ptr
                  ((shared_ptr<mocker::ir::RelationInst> *)local_4e8);
        if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_4_ == 0) {
          ir::dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)local_7b8,inst);
          bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_7b8);
          if (bVar2) {
            __range2._7_1_ = 0;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,"phi,",
                       (allocator<char> *)((long)&__range2 + 6));
            std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 6));
            __end2 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_40);
            s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_40);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)&s), bVar2) {
              local_7e0 = __gnu_cxx::
                          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&__end2);
              std::operator+(&local_800,local_7e0,",");
              std::__cxx11::string::operator+=
                        ((string *)__return_storage_ptr__,(string *)&local_800);
              std::__cxx11::string::~string((string *)&local_800);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end2);
            }
            p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_4_ = 1;
            __range2._7_1_ = 1;
          }
          else {
            p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_4_ = 0;
          }
          std::shared_ptr<mocker::ir::Phi>::~shared_ptr((shared_ptr<mocker::ir::Phi> *)local_7b8);
          if (p_1.super___shared_ptr<mocker::ir::ArithUnaryInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._4_4_ == 0) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/local_value_numbering.cpp"
                          ,0x86,
                          "std::string mocker::LocalValueNumbering::hash(const std::shared_ptr<ir::IRInst> &, const std::vector<std::size_t> &)"
                         );
          }
        }
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string
LocalValueNumbering::hash(const std::shared_ptr<ir::IRInst> &inst,
                          const std::vector<std::size_t> &valueNumbers) {
  using namespace std::string_literals;
  std::vector<std::string> vnStr;
  vnStr.reserve(valueNumbers.size());
  for (auto valueNumber : valueNumbers)
    vnStr.emplace_back(std::to_string(valueNumber));

  if (auto p = ir::dyc<ir::Assign>(inst)) {
    return hash(p->getOperand());
  }
  if (auto p = ir::dyc<ir::ArithUnaryInst>(inst)) {
    return (p->getOp() == ir::ArithUnaryInst::Neg ? "-"s : "~"s) + vnStr.at(0);
  }
  if (auto p = ir::dyc<ir::ArithBinaryInst>(inst)) {
    static const SmallMap<ir::ArithBinaryInst::OpType, std::string> names{
        {ir::ArithBinaryInst::BitOr, "|"s}, {ir::ArithBinaryInst::BitAnd, "&"s},
        {ir::ArithBinaryInst::Xor, "^"s},   {ir::ArithBinaryInst::Shl, "<<"s},
        {ir::ArithBinaryInst::Shr, ">>"s},  {ir::ArithBinaryInst::Add, "+"s},
        {ir::ArithBinaryInst::Sub, "-"s},   {ir::ArithBinaryInst::Mul, "*"s},
        {ir::ArithBinaryInst::Div, "/"s},   {ir::ArithBinaryInst::Mod, "%"s}};
    static const SmallMap<ir::ArithBinaryInst::OpType, int> associative{
        {ir::ArithBinaryInst::BitOr, 0}, {ir::ArithBinaryInst::BitAnd, 0},
        {ir::ArithBinaryInst::Xor, 0},   {ir::ArithBinaryInst::Add, 0},
        {ir::ArithBinaryInst::Mul, 0},
    };
    assert(vnStr.size() == 2);
    if (associative.in(p->getOp()) && valueNumbers[0] > valueNumbers[1])
      std::swap(vnStr[0], vnStr[1]);
    return names.at(p->getOp()) + vnStr.at(0) + "," + vnStr.at(1);
  }
  if (auto p = ir::dyc<ir::RelationInst>(inst)) {
    static const SmallMap<ir::RelationInst::OpType, std::string> names{
        {ir::RelationInst::Eq, "=="s}, {ir::RelationInst::Ne, "!="s},
        {ir::RelationInst::Lt, "<"s},  {ir::RelationInst::Gt, ">"s},
        {ir::RelationInst::Le, "<="s}, {ir::RelationInst::Ge, ">="s}};
    assert(vnStr.size() == 2);
    auto op = p->getOp();
    if (op == ir::RelationInst::Gt)
      return "<" + vnStr[1] + "," + vnStr[0];
    if (op == ir::RelationInst::Ge)
      return "<=" + vnStr[1] + "," + vnStr[0];

    if ((op == ir::RelationInst::Eq || op == ir::RelationInst::Ne) &&
        valueNumbers[0] > valueNumbers[1])
      std::swap(vnStr[0], vnStr[1]);
    return names.at(op) + vnStr[0] + "," + vnStr[1];
  }
  if (auto p = ir::dyc<ir::Phi>(inst)) {
    std::string res = "phi,";
    for (auto &s : vnStr)
      res += s + ",";
    return res;
  }
  assert(false);
}